

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

BasicTimeZone * __thiscall icu_63::Calendar::getBasicTimeZone(Calendar *this)

{
  long local_60;
  long local_50;
  long local_40;
  long local_30;
  Calendar *this_local;
  
  if (this->fZone == (TimeZone *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = __dynamic_cast(this->fZone,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
  }
  if (local_30 == 0) {
    if (this->fZone == (TimeZone *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(this->fZone,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0);
    }
    if (local_40 == 0) {
      if (this->fZone == (TimeZone *)0x0) {
        local_50 = 0;
      }
      else {
        local_50 = __dynamic_cast(this->fZone,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0);
      }
      if (local_50 == 0) {
        if (this->fZone == (TimeZone *)0x0) {
          local_60 = 0;
        }
        else {
          local_60 = __dynamic_cast(this->fZone,&TimeZone::typeinfo,&VTimeZone::typeinfo,0);
        }
        if (local_60 == 0) {
          return (BasicTimeZone *)0x0;
        }
      }
    }
  }
  return (BasicTimeZone *)this->fZone;
}

Assistant:

BasicTimeZone*
Calendar::getBasicTimeZone(void) const {
    if (dynamic_cast<const OlsonTimeZone *>(fZone) != NULL
        || dynamic_cast<const SimpleTimeZone *>(fZone) != NULL
        || dynamic_cast<const RuleBasedTimeZone *>(fZone) != NULL
        || dynamic_cast<const VTimeZone *>(fZone) != NULL) {
        return (BasicTimeZone*)fZone;
    }
    return NULL;
}